

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

void js_object_data_finalizer(JSRuntime *rt,JSValue val)

{
  JSValue v;
  int64_t in_RSI;
  JSObject *p;
  undefined4 in_stack_ffffffffffffffd0;
  uint in_stack_ffffffffffffffd4;
  JSValueUnion in_stack_ffffffffffffffd8;
  
  v.tag = in_RSI;
  v.u.float64 = in_stack_ffffffffffffffd8.float64;
  JS_FreeValueRT((JSRuntime *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),v);
  *(ulong *)(in_RSI + 0x30) = (ulong)in_stack_ffffffffffffffd4 << 0x20;
  *(undefined8 *)(in_RSI + 0x38) = 3;
  return;
}

Assistant:

static void js_object_data_finalizer(JSRuntime *rt, JSValue val)
{
    JSObject *p = JS_VALUE_GET_OBJ(val);
    JS_FreeValueRT(rt, p->u.object_data);
    p->u.object_data = JS_UNDEFINED;
}